

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

unique_ptr<psy::C::Compilation,_std::default_delete<psy::C::Compilation>_>
psy::C::Compilation::create(string *id,PlatformOptions platformOpts,InferenceOptions inferOpts)

{
  tuple<psy::C::Compilation::CompilationImpl_*,_std::default_delete<psy::C::Compilation::CompilationImpl>_>
  tVar1;
  Compilation *this;
  long lVar2;
  undefined4 in_EDX;
  PlatformOptions *pPVar3;
  unsigned_long_long *puVar4;
  byte bVar5;
  
  bVar5 = 0;
  this = (Compilation *)operator_new(8);
  Compilation(this);
  (id->_M_dataplus)._M_p = (pointer)this;
  std::__cxx11::string::_M_assign
            ((string *)
             ((long)(this->impl_)._M_t.
                    super___uniq_ptr_impl<psy::C::Compilation::CompilationImpl,_std::default_delete<psy::C::Compilation::CompilationImpl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_psy::C::Compilation::CompilationImpl_*,_std::default_delete<psy::C::Compilation::CompilationImpl>_>
             + 8));
  tVar1.
  super__Tuple_impl<0UL,_psy::C::Compilation::CompilationImpl_*,_std::default_delete<psy::C::Compilation::CompilationImpl>_>
  .super__Head_base<0UL,_psy::C::Compilation::CompilationImpl_*,_false>._M_head_impl =
       (this->impl_)._M_t.
       super___uniq_ptr_impl<psy::C::Compilation::CompilationImpl,_std::default_delete<psy::C::Compilation::CompilationImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_psy::C::Compilation::CompilationImpl_*,_std::default_delete<psy::C::Compilation::CompilationImpl>_>
  ;
  pPVar3 = &platformOpts;
  puVar4 = (unsigned_long_long *)
           ((long)tVar1.
                  super__Tuple_impl<0UL,_psy::C::Compilation::CompilationImpl_*,_std::default_delete<psy::C::Compilation::CompilationImpl>_>
                  .super__Head_base<0UL,_psy::C::Compilation::CompilationImpl_*,_false>._M_head_impl
           + 0x28);
  for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = pPVar3->maxValOfChar_;
    pPVar3 = (PlatformOptions *)((long)pPVar3 + (ulong)bVar5 * -0x10 + 8);
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  *(undefined4 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_psy::C::Compilation::CompilationImpl_*,_std::default_delete<psy::C::Compilation::CompilationImpl>_>
          .super__Head_base<0UL,_psy::C::Compilation::CompilationImpl_*,_false>._M_head_impl + 0x88)
       = in_EDX;
  return (__uniq_ptr_data<psy::C::Compilation,_std::default_delete<psy::C::Compilation>,_true,_true>
         )(__uniq_ptr_data<psy::C::Compilation,_std::default_delete<psy::C::Compilation>,_true,_true>
           )id;
}

Assistant:

std::unique_ptr<Compilation> Compilation::create(
        const std::string& id,
        PlatformOptions platformOpts,
        InferenceOptions inferOpts)
{
    std::unique_ptr<Compilation> compilation(new Compilation);
    compilation->P->id_ = id;
    compilation->P->platformOpts_ = platformOpts;
    compilation->P->inferOpts_ = inferOpts;
    return compilation;
}